

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O1

int h264_coeff_token(bitstream *str,h264_slice *slice,int cat,int idx,uint32_t *trailingOnes,
                    uint32_t *totalCoeff)

{
  bool bVar1;
  int iVar2;
  h264_macroblock *phVar3;
  h264_macroblock *phVar4;
  uint inter;
  int iVar5;
  int iVar6;
  vs_vlc_val *tab;
  h264_block_size unaff_R12D;
  long lVar7;
  uint32_t tmp;
  int idxA;
  int idxB;
  uint local_58;
  int local_54;
  bitstream *local_50;
  uint *local_48;
  uint *local_40;
  int local_34;
  
  bVar1 = true;
  switch(cat) {
  case 0:
  case 1:
  case 2:
  case 5:
    lVar7 = 0;
    unaff_R12D = H264_BLOCK_4X4;
    break;
  case 3:
    tab = coeff_token_m2;
    if (slice->chroma_array_type == 1) {
      tab = coeff_token_m1;
    }
    lVar7 = 0;
    bVar1 = false;
    goto LAB_0010b5d5;
  case 4:
    iVar6 = idx >> 3;
    idx = idx & 7;
    lVar7 = (long)(iVar6 + 1);
    unaff_R12D = H264_BLOCK_CHROMA;
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    unaff_R12D = H264_BLOCK_4X4;
    lVar7 = 1;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    unaff_R12D = H264_BLOCK_4X4;
    lVar7 = 2;
    break;
  default:
    abort();
  }
  tab = (vs_vlc_val *)0x0;
LAB_0010b5d5:
  if (bVar1) {
    local_50 = str;
    local_48 = trailingOnes;
    local_40 = totalCoeff;
    phVar3 = h264_mb_nb_p(slice,H264_MB_THIS,0);
    inter = (uint)(0x1a < phVar3->mb_type);
    phVar3 = h264_mb_nb_b(slice,H264_MB_A,unaff_R12D,inter,idx,&local_54);
    phVar4 = h264_mb_nb_b(slice,H264_MB_B,unaff_R12D,inter,idx,&local_34);
    phVar3 = h264_inter_filter(slice,phVar3,inter);
    phVar4 = h264_inter_filter(slice,phVar4,inter);
    iVar6 = phVar3->total_coeff[lVar7][local_54];
    iVar2 = phVar4->total_coeff[lVar7][local_34];
    if ((phVar3->mb_type == 0x39) || (phVar4->mb_type == 0x39)) {
      iVar5 = 0;
      if (phVar4->mb_type != 0x39) {
        iVar5 = iVar2;
      }
      if (phVar3->mb_type != 0x39) {
        iVar5 = iVar6;
      }
    }
    else {
      iVar5 = iVar2 + iVar6 + 1 >> 1;
    }
    tab = (vs_vlc_val *)(coeff_token_tab_rel + *(int *)(coeff_token_tab_rel + (long)iVar5 * 4));
    totalCoeff = local_40;
    str = local_50;
    trailingOnes = local_48;
  }
  local_58 = *trailingOnes << 8 | *totalCoeff;
  iVar2 = vs_vlc(str,&local_58,tab);
  iVar6 = 1;
  if (iVar2 == 0) {
    iVar6 = 0;
    if (str->dir == VS_DECODE) {
      *trailingOnes = local_58 >> 8;
      *totalCoeff = local_58 & 0xff;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int h264_coeff_token(struct bitstream *str, struct h264_slice *slice, int cat, int idx, uint32_t *trailingOnes, uint32_t *totalCoeff) {
	const struct vs_vlc_val *tab = 0;
	enum h264_block_size bs;
	int which;
	switch (cat) {
		case H264_CTXBLOCKCAT_CHROMA_DC:
			if (slice->chroma_array_type == 1)
				tab = coeff_token_m1;
			else
				tab = coeff_token_m2;
			break;
		case H264_CTXBLOCKCAT_CHROMA_AC:
			which = (idx >> 3) + 1;
			idx &= 7;
			bs = H264_BLOCK_CHROMA;
			break;
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_LUMA_8X8:
			which = 0;
			bs = H264_BLOCK_4X4;
			break;
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CB_8X8:
			which = 1;
			bs = H264_BLOCK_4X4;
			break;
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CR_8X8:
			which = 2;
			bs = H264_BLOCK_4X4;
			break;
		default:
			abort();
	}
	if (!tab) {
		int idxA, idxB;
		const struct h264_macroblock *mbT = h264_mb_nb_p(slice, H264_MB_THIS, 0);
		int inter = h264_is_inter_mb_type(mbT->mb_type);
		const struct h264_macroblock *mbA = h264_mb_nb_b(slice, H264_MB_A, bs, inter, idx, &idxA);
		const struct h264_macroblock *mbB = h264_mb_nb_b(slice, H264_MB_B, bs, inter, idx, &idxB);
		mbA = h264_inter_filter(slice, mbA, inter);
		mbB = h264_inter_filter(slice, mbB, inter);
		int availA = mbA->mb_type != H264_MB_TYPE_UNAVAIL;
		int availB = mbB->mb_type != H264_MB_TYPE_UNAVAIL;
		int nA = mbA->total_coeff[which][idxA];
		int nB = mbB->total_coeff[which][idxB];
		int nC;
		if (availA && availB)
			nC = (nA + nB + 1) >> 1;
		else if (availA)
			nC = nA;
		else if (availB)
			nC = nB;
		else
			nC = 0;
		tab = coeff_token_tab[nC];
	}
	uint32_t tmp;
	tmp = *trailingOnes << 8 | *totalCoeff;
	if (vs_vlc(str, &tmp, tab)) return 1;
	if (str->dir == VS_DECODE) {
		*trailingOnes = tmp >> 8;
		*totalCoeff = tmp & 0xff;
	}
	return 0;
}